

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O1

cmListFileLexer_Token * cmListFileLexer_Scan(cmListFileLexer *lexer)

{
  int iVar1;
  
  if (lexer->file != (FILE *)0x0) {
    iVar1 = cmListFileLexer_yylex(lexer->scanner,lexer);
    if (iVar1 != 0) {
      return &lexer->token;
    }
    cmListFileLexer_SetFileName(lexer,(char *)0x0,(cmListFileLexer_BOM *)0x0);
  }
  return (cmListFileLexer_Token *)0x0;
}

Assistant:

cmListFileLexer_Token* cmListFileLexer_Scan(cmListFileLexer* lexer)
{
  if (!lexer->file) {
    return 0;
  }
  if (cmListFileLexer_yylex(lexer->scanner, lexer)) {
    return &lexer->token;
  } else {
    cmListFileLexer_SetFileName(lexer, 0, 0);
    return 0;
  }
}